

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O2

void __thiscall PSBTInput::Serialize<DataStream>(PSBTInput *this,DataStream *s)

{
  uint uVar1;
  KeyOriginInfo hd_keypath;
  map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
  *pmVar2;
  map<uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *pmVar3;
  map<uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *pmVar4;
  map<XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>_>_>_>
  *pmVar5;
  byte bVar6;
  bool bVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  uint uVar10;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff58;
  PSBTInput *pPVar11;
  DataStream *s_00;
  _Rb_tree_node_base *p_Var12;
  VectorWriter s_value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value_v;
  KeyOriginInfo local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->non_witness_utxo).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&value_v);
    value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "";
    value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)this;
    SerializeToVector<DataStream,ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>const>>
              (s,(ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_> *)
                 &value_v);
  }
  if ((this->witness_utxo).nValue != -1) {
    value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = &DAT_00000001;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&value_v);
    SerializeToVector<DataStream,CTxOut>(s,&this->witness_utxo);
  }
  uVar1 = (this->final_script_sig).super_CScriptBase._size;
  uVar10 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar10 = uVar1;
  }
  if ((uVar10 == 0) &&
     ((this->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    pmVar2 = &this->partial_sigs;
    s_00 = s;
    for (p_Var8 = (this->partial_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      s_value.vchData = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2;
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&p_Var8[1]._M_right;
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x21;
      if ((*(byte *)&p_Var8[1]._M_right & 0xfe) != 2) {
        bVar6 = *(byte *)&p_Var8[1]._M_right - 4;
        if (bVar6 < 4) {
          value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = *(pointer *)(&DAT_00b5ace0 + (ulong)bVar6 * 8);
        }
        else {
          value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
        }
      }
      SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                (s,(CompactSizeWriter *)&s_value,(Span<const_unsigned_char> *)&value_v);
      Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var8 + 4));
    }
    pPVar11 = this;
    s = s_00;
    if ((this->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged != false) {
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x3;
      SerializeToVector<DataStream,CompactSizeWriter>(s_00,(CompactSizeWriter *)&value_v);
      SerializeToVector<DataStream,int>(s_00,(int *)&this->sighash_type);
    }
    uVar1 = (this->redeem_script).super_CScriptBase._size;
    uVar10 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar10 = uVar1;
    }
    if (uVar10 != 0) {
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x4;
      SerializeToVector<DataStream,CompactSizeWriter>(s_00,(CompactSizeWriter *)&value_v);
      Serialize<DataStream,28u,unsigned_char>(s_00,&(this->redeem_script).super_CScriptBase);
    }
    uVar1 = (this->witness_script).super_CScriptBase._size;
    uVar10 = uVar1 - 0x1d;
    if (uVar1 < 0x1d) {
      uVar10 = uVar1;
    }
    if (uVar10 != 0) {
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x5;
      SerializeToVector<DataStream,CompactSizeWriter>(s_00,(CompactSizeWriter *)&value_v);
      Serialize<DataStream,28u,unsigned_char>(s_00,&(this->witness_script).super_CScriptBase);
    }
    SerializeHDKeypaths<DataStream>(s_00,&this->hd_keypaths,(CompactSizeWriter)0x6);
    for (p_Var8 = (this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(this->ripemd160_preimages)._M_t._M_impl.super__Rb_tree_header
        ; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(p_Var8 + 1);
      s_value.vchData = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xa;
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x14;
      SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                (s_00,(CompactSizeWriter *)&s_value,(Span<const_unsigned_char> *)&value_v);
      Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                (s_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var8[1]._M_right);
    }
    pmVar3 = &pPVar11->sha256_preimages;
    for (p_Var8 = (pPVar11->sha256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(p_Var8 + 1);
      s_value.vchData = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xb;
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x20;
      SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                (s_00,(CompactSizeWriter *)&s_value,(Span<const_unsigned_char> *)&value_v);
      Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                (s_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var8 + 2));
    }
    pmVar4 = &pPVar11->hash160_preimages;
    for (p_Var8 = (pPVar11->hash160_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(p_Var8 + 1);
      s_value.vchData = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xc;
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x14;
      SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                (s_00,(CompactSizeWriter *)&s_value,(Span<const_unsigned_char> *)&value_v);
      Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                (s_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var8[1]._M_right);
    }
    pmVar3 = &pPVar11->hash256_preimages;
    for (p_Var8 = (pPVar11->hash256_preimages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(p_Var8 + 1);
      s_value.vchData = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xd;
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x20;
      SerializeToVector<DataStream,CompactSizeWriter,Span<unsigned_char_const>>
                (s_00,(CompactSizeWriter *)&s_value,(Span<const_unsigned_char> *)&value_v);
      Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                (s_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var8 + 2));
    }
    this = pPVar11;
    if ((pPVar11->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (pPVar11->m_tap_key_sig).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      SerializeToVector<DataStream,unsigned_char>(s_00,"\x13\x14\x15\x16\x17\x18\x05\x06\a");
      Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                (s_00,&pPVar11->m_tap_key_sig);
    }
    for (p_Var8 = (pPVar11->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 !=
        &(pPVar11->m_tap_script_sigs)._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      SerializeToVector<DataStream,unsigned_char,XOnlyPubKey,uint256>
                (s_00,"\x14\x15\x16\x17\x18\x05\x06\a",(XOnlyPubKey *)(p_Var8 + 1),
                 (uint256 *)(p_Var8 + 2));
      Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                (s_00,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var8 + 3));
    }
    p_Var12 = &(this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header._M_header;
    for (p_Var8 = (this->m_tap_scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var8 != p_Var12; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      for (p_Var9 = p_Var8[2]._M_right; p_Var9 != (_Base_ptr)&p_Var8[2]._M_parent;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = *(pointer *)(p_Var9 + 1);
        value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((long)p_Var9[1]._M_parent -
                      (long)value_v.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
        SerializeToVector<DataStream,unsigned_char,Span<unsigned_char_const>>
                  (s,"\x15\x16\x17\x18\x05\x06\a",(Span<const_unsigned_char> *)&value_v);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&value_v,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )*(uchar **)(p_Var8 + 1),
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )p_Var8[1]._M_parent,(allocator_type *)&s_value);
        s_value.vchData =
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT71(s_value.vchData._1_7_,*(undefined1 *)&p_Var8[1]._M_right);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (&value_v,(uchar *)&s_value);
        Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&value_v);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&value_v);
      }
    }
    pmVar5 = &this->m_tap_bip32_paths;
    for (p_Var8 = (this->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      SerializeToVector<DataStream,unsigned_char,XOnlyPubKey>
                (s,"\x16\x17\x18\x05\x06\a",(XOnlyPubKey *)(p_Var8 + 1));
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      VectorWriter::VectorWriter
                (&s_value,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          &value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                 ,0);
      Serialize<VectorWriter,uint256,std::less<uint256>,std::allocator<uint256>>
                (&s_value,(set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)(p_Var8 + 2)
                );
      KeyOriginInfo::KeyOriginInfo(&local_58,(KeyOriginInfo *)&p_Var8[3]._M_left);
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)this;
      hd_keypath.fingerprint[0] = (char)in_stack_ffffffffffffff58;
      hd_keypath.fingerprint[1] = (char)((ulong)in_stack_ffffffffffffff58 >> 8);
      hd_keypath.fingerprint[2] = (char)((ulong)in_stack_ffffffffffffff58 >> 0x10);
      hd_keypath.fingerprint[3] = (char)((ulong)in_stack_ffffffffffffff58 >> 0x18);
      hd_keypath._4_4_ = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)s;
      hd_keypath.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = &p_Var12->_M_color;
      SerializeKeyOrigin<VectorWriter>(&s_value,hd_keypath);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&local_58.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
                (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    pPVar11 = this;
    bVar7 = base_blob<256U>::IsNull((base_blob<256U> *)&this->m_tap_internal_key);
    if (!bVar7) {
      SerializeToVector<DataStream,unsigned_char>(s,"\x17\x18\x05\x06\a");
      ToByteVector<XOnlyPubKey>(&value_v,&this->m_tap_internal_key);
      Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>(s,&value_v);
      this = pPVar11;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    }
    bVar7 = base_blob<256U>::IsNull(&(this->m_tap_merkle_root).super_base_blob<256U>);
    if (!bVar7) {
      SerializeToVector<DataStream,unsigned_char>(s,"\x18\x05\x06\a");
      SerializeToVector<DataStream,uint256>(s,&this->m_tap_merkle_root);
    }
  }
  uVar1 = (this->final_script_sig).super_CScriptBase._size;
  uVar10 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar10 = uVar1;
  }
  if (uVar10 != 0) {
    value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x7;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&value_v);
    Serialize<DataStream,28u,unsigned_char>(s,&(this->final_script_sig).super_CScriptBase);
  }
  if ((this->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->final_script_witness).stack.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    value_v.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x8;
    SerializeToVector<DataStream,CompactSizeWriter>(s,(CompactSizeWriter *)&value_v);
    SerializeToVector<DataStream,std::vector<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
              (s,&(this->final_script_witness).stack);
  }
  for (p_Var8 = (this->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(this->m_proprietary)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var8 + 2));
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var8[2]._M_right);
  }
  for (p_Var8 = (this->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(this->unknown)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)(p_Var8 + 1));
    Serialize<DataStream,unsigned_char,std::allocator<unsigned_char>>
              (s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p_Var8[1]._M_right);
  }
  DataStream::operator<<(s,"");
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void Serialize(Stream& s) const {
        // Write the utxo
        if (non_witness_utxo) {
            SerializeToVector(s, CompactSizeWriter(PSBT_IN_NON_WITNESS_UTXO));
            SerializeToVector(s, TX_NO_WITNESS(non_witness_utxo));
        }
        if (!witness_utxo.IsNull()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_IN_WITNESS_UTXO));
            SerializeToVector(s, witness_utxo);
        }

        if (final_script_sig.empty() && final_script_witness.IsNull()) {
            // Write any partial signatures
            for (const auto& sig_pair : partial_sigs) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_PARTIAL_SIG), Span{sig_pair.second.first});
                s << sig_pair.second.second;
            }

            // Write the sighash type
            if (sighash_type != std::nullopt) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_SIGHASH));
                SerializeToVector(s, *sighash_type);
            }

            // Write the redeem script
            if (!redeem_script.empty()) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_REDEEMSCRIPT));
                s << redeem_script;
            }

            // Write the witness script
            if (!witness_script.empty()) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_WITNESSSCRIPT));
                s << witness_script;
            }

            // Write any hd keypaths
            SerializeHDKeypaths(s, hd_keypaths, CompactSizeWriter(PSBT_IN_BIP32_DERIVATION));

            // Write any ripemd160 preimage
            for (const auto& [hash, preimage] : ripemd160_preimages) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_RIPEMD160), Span{hash});
                s << preimage;
            }

            // Write any sha256 preimage
            for (const auto& [hash, preimage] : sha256_preimages) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_SHA256), Span{hash});
                s << preimage;
            }

            // Write any hash160 preimage
            for (const auto& [hash, preimage] : hash160_preimages) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_HASH160), Span{hash});
                s << preimage;
            }

            // Write any hash256 preimage
            for (const auto& [hash, preimage] : hash256_preimages) {
                SerializeToVector(s, CompactSizeWriter(PSBT_IN_HASH256), Span{hash});
                s << preimage;
            }

            // Write taproot key sig
            if (!m_tap_key_sig.empty()) {
                SerializeToVector(s, PSBT_IN_TAP_KEY_SIG);
                s << m_tap_key_sig;
            }

            // Write taproot script sigs
            for (const auto& [pubkey_leaf, sig] : m_tap_script_sigs) {
                const auto& [xonly, leaf_hash] = pubkey_leaf;
                SerializeToVector(s, PSBT_IN_TAP_SCRIPT_SIG, xonly, leaf_hash);
                s << sig;
            }

            // Write taproot leaf scripts
            for (const auto& [leaf, control_blocks] : m_tap_scripts) {
                const auto& [script, leaf_ver] = leaf;
                for (const auto& control_block : control_blocks) {
                    SerializeToVector(s, PSBT_IN_TAP_LEAF_SCRIPT, Span{control_block});
                    std::vector<unsigned char> value_v(script.begin(), script.end());
                    value_v.push_back((uint8_t)leaf_ver);
                    s << value_v;
                }
            }

            // Write taproot bip32 keypaths
            for (const auto& [xonly, leaf_origin] : m_tap_bip32_paths) {
                const auto& [leaf_hashes, origin] = leaf_origin;
                SerializeToVector(s, PSBT_IN_TAP_BIP32_DERIVATION, xonly);
                std::vector<unsigned char> value;
                VectorWriter s_value{value, 0};
                s_value << leaf_hashes;
                SerializeKeyOrigin(s_value, origin);
                s << value;
            }

            // Write taproot internal key
            if (!m_tap_internal_key.IsNull()) {
                SerializeToVector(s, PSBT_IN_TAP_INTERNAL_KEY);
                s << ToByteVector(m_tap_internal_key);
            }

            // Write taproot merkle root
            if (!m_tap_merkle_root.IsNull()) {
                SerializeToVector(s, PSBT_IN_TAP_MERKLE_ROOT);
                SerializeToVector(s, m_tap_merkle_root);
            }
        }

        // Write script sig
        if (!final_script_sig.empty()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_IN_SCRIPTSIG));
            s << final_script_sig;
        }
        // write script witness
        if (!final_script_witness.IsNull()) {
            SerializeToVector(s, CompactSizeWriter(PSBT_IN_SCRIPTWITNESS));
            SerializeToVector(s, final_script_witness.stack);
        }

        // Write proprietary things
        for (const auto& entry : m_proprietary) {
            s << entry.key;
            s << entry.value;
        }

        // Write unknown things
        for (auto& entry : unknown) {
            s << entry.first;
            s << entry.second;
        }

        s << PSBT_SEPARATOR;
    }